

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O1

Cut_Cut_t * Cut_NodeUnionCuts(Cut_Man_t *p,Vec_Int_t *vNodes)

{
  uint uVar1;
  uint uVar2;
  __time_t _Var3;
  int iVar4;
  int iVar5;
  long lVar6;
  Cut_Cut_t *pCVar7;
  void **ppvVar8;
  Vec_Ptr_t *pVVar9;
  timespec *ptVar10;
  long lVar11;
  Cut_Cut_t *pCVar12;
  Cut_Cut_t *pCVar13;
  long lVar14;
  Cut_Cut_t *pHead;
  Cut_List_t Super;
  Cut_Cut_t *local_130;
  timespec local_110;
  Cut_List_t local_100;
  
  uVar1 = p->pParams->nVarsMax;
  iVar4 = clock_gettime(3,(timespec *)&local_100);
  if (iVar4 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_100.pHead[1]),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + (long)local_100.pHead[0] * -1000000;
  }
  local_100.pHead[1] = (Cut_Cut_t *)0x0;
  local_100.pHead[2] = (Cut_Cut_t *)0x0;
  local_100.pHead[3] = (Cut_Cut_t *)0x0;
  local_100.pHead[4] = (Cut_Cut_t *)0x0;
  local_100.pHead[5] = (Cut_Cut_t *)0x0;
  local_100.pHead[6] = (Cut_Cut_t *)0x0;
  local_100.pHead[7] = (Cut_Cut_t *)0x0;
  local_100.pHead[8] = (Cut_Cut_t *)0x0;
  local_100.pHead[9] = (Cut_Cut_t *)0x0;
  local_100.pHead[10] = (Cut_Cut_t *)0x0;
  local_100.pHead[0xb] = (Cut_Cut_t *)0x0;
  local_100.pHead[0xc] = (Cut_Cut_t *)0x0;
  lVar6 = 8;
  do {
    *(long *)((long)local_100.ppTail + lVar6) = (long)local_100.pHead + lVar6;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x68);
  if (vNodes->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar4 = *vNodes->pArray;
  p->nNodeCuts = 1;
  p->vTemp->nSize = 0;
  if (vNodes->nSize < 1) {
    local_130 = (Cut_Cut_t *)0x0;
  }
  else {
    lVar6 = 1;
    lVar14 = 0;
    local_130 = (Cut_Cut_t *)0x0;
    do {
      iVar5 = vNodes->pArray[lVar14];
      pCVar7 = Cut_NodeReadCutsNew(p,iVar5);
      Cut_NodeWriteCutsNew(p,iVar5,(Cut_Cut_t *)0x0);
      if (pCVar7 == (Cut_Cut_t *)0x0) {
        __assert_fail("pList",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutNode.c"
                      ,700,"Cut_Cut_t *Cut_NodeUnionCuts(Cut_Man_t *, Vec_Int_t *)");
      }
      pCVar13 = pCVar7->pNext;
      pCVar7->pNext = (Cut_Cut_t *)0x0;
      if (lVar14 == 0) {
        if (0xbfffffff < *(uint *)pCVar7 + 0xf0000000) {
LAB_00437d8f:
          __assert_fail("pCut->nLeaves > 0 && pCut->nLeaves <= CUT_SIZE_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutList.h"
                        ,0x59,"void Cut_ListAdd(Cut_List_t *, Cut_Cut_t *)");
        }
        *local_100.ppTail[*(uint *)pCVar7 >> 0x1c] = pCVar7;
        local_100.ppTail[*(uint *)pCVar7 >> 0x1c] = &pCVar7->pNext;
        local_130 = pCVar7;
      }
      else {
        Cut_CutRecycle(p,pCVar7);
      }
      if (pCVar13 != (Cut_Cut_t *)0x0) {
        pCVar7 = pCVar13->pNext;
        while (pCVar12 = pCVar7, *(uint *)pCVar13 >> 0x1c != uVar1) {
          if ((p->pParams->fFilter == 0) ||
             (iVar5 = Cut_CutFilterOne(p,&local_100,pCVar13), iVar5 == 0)) {
            uVar2 = *(uint *)pCVar13;
            *(uint *)pCVar13 = (uVar2 & 0xff7fffff) + ((*(uint *)local_130 ^ uVar2) & 0x400000) * 2;
            pCVar7 = pCVar13->pNext;
            pCVar13->pNext = (Cut_Cut_t *)0x0;
            if (0xbfffffff < uVar2 + 0xf0000000) goto LAB_00437d8f;
            *local_100.ppTail[uVar2 >> 0x1c] = pCVar13;
            local_100.ppTail[*(uint *)pCVar13 >> 0x1c] = &pCVar13->pNext;
            iVar5 = p->nNodeCuts + 1;
            p->nNodeCuts = iVar5;
            if (iVar5 == p->pParams->nKeepMax) {
              if (pCVar7 != (Cut_Cut_t *)0x0) {
                for (pCVar13 = pCVar7->pNext; Cut_CutRecycle(p,pCVar7), pCVar13 != (Cut_Cut_t *)0x0;
                    pCVar13 = pCVar13->pNext) {
                  pCVar7 = pCVar13;
                }
              }
              if ((int)lVar14 + 1 < vNodes->nSize) {
                do {
                  Cut_NodeFreeCuts(p,vNodes->pArray[lVar6]);
                  lVar6 = lVar6 + 1;
                } while ((int)lVar6 < vNodes->nSize);
              }
              pVVar9 = p->vTemp;
              if (0 < pVVar9->nSize) {
                lVar6 = 0;
                do {
                  pCVar7 = (Cut_Cut_t *)pVVar9->pArray[lVar6];
                  if (pCVar7 != (Cut_Cut_t *)0x0) {
                    for (pCVar13 = pCVar7->pNext; Cut_CutRecycle(p,pCVar7),
                        pCVar13 != (Cut_Cut_t *)0x0; pCVar13 = pCVar13->pNext) {
                      pCVar7 = pCVar13;
                    }
                  }
                  lVar6 = lVar6 + 1;
                  pVVar9 = p->vTemp;
                } while (lVar6 < pVVar9->nSize);
              }
              goto LAB_00437cb1;
            }
          }
          if (pCVar12 == (Cut_Cut_t *)0x0) goto LAB_00437a38;
          pCVar7 = pCVar12->pNext;
          pCVar13 = pCVar12;
        }
        pVVar9 = p->vTemp;
        uVar2 = pVVar9->nCap;
        if (pVVar9->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar9->pArray,0x80);
            }
            pVVar9->pArray = ppvVar8;
            iVar5 = 0x10;
          }
          else {
            iVar5 = uVar2 * 2;
            if (iVar5 <= (int)uVar2) goto LAB_00437a26;
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar9->pArray,(ulong)uVar2 << 4);
            }
            pVVar9->pArray = ppvVar8;
          }
          pVVar9->nCap = iVar5;
        }
LAB_00437a26:
        iVar5 = pVVar9->nSize;
        pVVar9->nSize = iVar5 + 1;
        pVVar9->pArray[iVar5] = pCVar13;
      }
LAB_00437a38:
      lVar14 = lVar14 + 1;
      lVar6 = lVar6 + 1;
    } while (lVar14 < vNodes->nSize);
  }
  pVVar9 = p->vTemp;
  if (0 < pVVar9->nSize) {
    lVar6 = 1;
    lVar14 = 0;
    do {
      pCVar7 = (Cut_Cut_t *)pVVar9->pArray[lVar14];
      if (pCVar7 != (Cut_Cut_t *)0x0) {
        pCVar13 = pCVar7->pNext;
        while( true ) {
          pCVar12 = pCVar13;
          if ((p->pParams->fFilter == 0) ||
             (iVar5 = Cut_CutFilterOne(p,&local_100,pCVar7), iVar5 == 0)) {
            uVar1 = *(uint *)pCVar7;
            *(uint *)pCVar7 = (uVar1 & 0xff7fffff) + ((*(uint *)local_130 ^ uVar1) & 0x400000) * 2;
            pCVar13 = pCVar7->pNext;
            pCVar7->pNext = (Cut_Cut_t *)0x0;
            if (0xbfffffff < uVar1 + 0xf0000000) goto LAB_00437d8f;
            *local_100.ppTail[uVar1 >> 0x1c] = pCVar7;
            local_100.ppTail[*(uint *)pCVar7 >> 0x1c] = &pCVar7->pNext;
            iVar5 = p->nNodeCuts + 1;
            p->nNodeCuts = iVar5;
            if (iVar5 == p->pParams->nKeepMax) {
              if (pCVar13 != (Cut_Cut_t *)0x0) {
                for (pCVar7 = pCVar13->pNext; Cut_CutRecycle(p,pCVar13), pCVar7 != (Cut_Cut_t *)0x0;
                    pCVar7 = pCVar7->pNext) {
                  pCVar13 = pCVar7;
                }
              }
              pVVar9 = p->vTemp;
              if ((int)lVar14 + 1 < pVVar9->nSize) {
                do {
                  pCVar7 = (Cut_Cut_t *)pVVar9->pArray[lVar6];
                  if (pCVar7 != (Cut_Cut_t *)0x0) {
                    for (pCVar13 = pCVar7->pNext; Cut_CutRecycle(p,pCVar7),
                        pCVar13 != (Cut_Cut_t *)0x0; pCVar13 = pCVar13->pNext) {
                      pCVar7 = pCVar13;
                    }
                  }
                  lVar6 = lVar6 + 1;
                  pVVar9 = p->vTemp;
                } while ((int)lVar6 < pVVar9->nSize);
              }
              goto LAB_00437cb1;
            }
          }
          if (pCVar12 == (Cut_Cut_t *)0x0) break;
          pCVar13 = pCVar12->pNext;
          pCVar7 = pCVar12;
        }
      }
      lVar14 = lVar14 + 1;
      pVVar9 = p->vTemp;
      lVar6 = lVar6 + 1;
    } while (lVar14 < pVVar9->nSize);
  }
LAB_00437cb1:
  pCVar7 = Cut_NodeReadCutsNew(p,iVar4);
  if (pCVar7 != (Cut_Cut_t *)0x0) {
    __assert_fail("Cut_NodeReadCutsNew(p, Root) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutNode.c"
                  ,0x303,"Cut_Cut_t *Cut_NodeUnionCuts(Cut_Man_t *, Vec_Int_t *)");
  }
  ptVar10 = &local_110;
  local_110.tv_sec = 0;
  lVar6 = 1;
  do {
    if (local_100.pHead[lVar6] != (Cut_Cut_t *)0x0) {
      ptVar10->tv_sec = (__time_t)local_100.pHead[lVar6];
      ptVar10 = (timespec *)local_100.ppTail[lVar6];
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xd);
  ptVar10->tv_sec = 0;
  _Var3 = local_110.tv_sec;
  Cut_NodeWriteCutsNew(p,iVar4,(Cut_Cut_t *)local_110.tv_sec);
  iVar4 = clock_gettime(3,&local_110);
  if (iVar4 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
  }
  p->timeUnion = p->timeUnion + lVar6 + lVar11;
  p->nNodes = (p->nNodes - vNodes->nSize) + 1;
  return (Cut_Cut_t *)_Var3;
}

Assistant:

Cut_Cut_t * Cut_NodeUnionCuts( Cut_Man_t * p, Vec_Int_t * vNodes )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pList, * pListStart, * pCut, * pCut2;
    Cut_Cut_t * pTop = NULL; // Suppress "might be used uninitialized"
    int i, k, Node, Root, Limit = p->pParams->nVarsMax;
    abctime clk = Abc_Clock();

    // start the new list
    Cut_ListStart( pSuper );

    // remember the root node to save the resulting cuts
    Root = Vec_IntEntry( vNodes, 0 );
    p->nNodeCuts = 1;

    // collect small cuts first
    Vec_PtrClear( p->vTemp );
    Vec_IntForEachEntry( vNodes, Node, i )
    {
        // get the cuts of this node
        pList = Cut_NodeReadCutsNew( p, Node );
        Cut_NodeWriteCutsNew( p, Node, NULL );
        assert( pList );
        // remember the starting point
        pListStart = pList->pNext;
        pList->pNext = NULL;
        // save or recycle the elementary cut
        if ( i == 0 )
            Cut_ListAdd( pSuper, pList ), pTop = pList;
        else
            Cut_CutRecycle( p, pList );
        // save all the cuts that are smaller than the limit
        Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
        {
            if ( pCut->nLeaves == (unsigned)Limit )
            {
                Vec_PtrPush( p->vTemp, pCut );
                break;
            }
            // check containment
            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
                continue;
            // set the complemented bit by comparing the first cut with the current cut
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart = pCut->pNext;
            pCut->pNext = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts of this node
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle all cuts of other nodes
                Vec_IntForEachEntryStart( vNodes, Node, k, i+1 )
                    Cut_NodeFreeCuts( p, Node );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, k )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    } 
    // collect larger cuts next
    Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, i )
    {
        Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        {
            // check containment
            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
                continue;
            // set the complemented bit
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart = pCut->pNext;
            pCut->pNext = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntryStart( Cut_Cut_t *, p->vTemp, pList, k, i+1 )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    }
finish :
    // set the cuts at the node
    assert( Cut_NodeReadCutsNew(p, Root) == NULL );
    pList = Cut_ListFinish( pSuper );
    Cut_NodeWriteCutsNew( p, Root, pList );
p->timeUnion += Abc_Clock() - clk;
    // filter the cuts
//clk = Abc_Clock();
//    if ( p->pParams->fFilter )
//        Cut_CutFilter( p, pList );
//p->timeFilter += Abc_Clock() - clk;
    p->nNodes -= vNodes->nSize - 1;
    return pList;
}